

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

uint16_t inl_qrdmlah_s16(CPUARMState_conflict *env,int16_t src1,int16_t src2,int16_t src3)

{
  bool bVar1;
  int local_1c;
  int32_t ret;
  int16_t src3_local;
  int16_t src2_local;
  int16_t src1_local;
  CPUARMState_conflict *env_local;
  
  local_1c = src3 * 0x8000 + (int)src1 * (int)src2 + 0x4000 >> 0xf;
  if (local_1c != (short)local_1c) {
    (env->vfp).qc[0] = 1;
    bVar1 = local_1c < 0;
    local_1c = 0x7fff;
    if (bVar1) {
      local_1c = -0x8000;
    }
  }
  return (uint16_t)local_1c;
}

Assistant:

static uint16_t inl_qrdmlah_s16(CPUARMState *env, int16_t src1,
                                int16_t src2, int16_t src3)
{
    /* Simplify:
     * = ((a3 << 16) + ((e1 * e2) << 1) + (1 << 15)) >> 16
     * = ((a3 << 15) + (e1 * e2) + (1 << 14)) >> 15
     */
    int32_t ret = (int32_t)src1 * src2;
    ret = ((int32_t)src3 << 15) + ret + (1 << 14);
    ret >>= 15;
    if (ret != (int16_t)ret) {
        SET_QC();
        ret = (ret < 0 ? -0x8000 : 0x7fff);
    }
    return ret;
}